

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O2

string_t __thiscall
duckdb::TrimOperator<true,false>::Operation<duckdb::string_t,duckdb::string_t>
          (TrimOperator<true,false> *this,string_t input,Vector *result)

{
  ulong uVar1;
  utf8proc_category_t uVar2;
  utf8proc_ssize_t uVar3;
  StringVector *len;
  StringVector *extraout_RDX;
  long lVar4;
  char *__dest;
  ulong uVar5;
  Vector *vector;
  ulong uVar6;
  utf8proc_int32_t codepoint;
  string_t target;
  utf8proc_int32_t local_5c;
  StringVector *local_58;
  anon_union_16_2_67f50693_for_value local_50;
  undefined8 local_40;
  long local_38;
  
  len = input.value._8_8_;
  local_38 = input.value._0_8_;
  lVar4 = local_38;
  if ((uint)this < 0xd) {
    lVar4 = (long)&local_40 + 4;
  }
  uVar6 = (ulong)this & 0xffffffff;
  uVar1 = 0;
  local_58 = len;
  local_40 = this;
  do {
    uVar5 = uVar1;
    vector = (Vector *)(uVar6 - uVar5);
    if (uVar6 < uVar5 || vector == (Vector *)0x0) break;
    vector = (Vector *)(uVar6 - uVar5);
    uVar3 = utf8proc_iterate((utf8proc_uint8_t *)(lVar4 + uVar5),(utf8proc_ssize_t)vector,&local_5c)
    ;
    uVar2 = utf8proc_category(local_5c);
    len = extraout_RDX;
    uVar1 = uVar3 + uVar5;
  } while (uVar2 == UTF8PROC_CATEGORY_ZS);
  local_50.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)StringVector::EmptyString(local_58,vector,(idx_t)len);
  __dest = local_50.pointer.prefix;
  if (0xc < local_50._0_4_) {
    __dest = local_50._8_8_;
  }
  switchD_00916250::default(__dest,(void *)(lVar4 + uVar5),(size_t)vector);
  string_t::Finalize((string_t *)&local_50.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}